

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::r_formatter<spdlog::details::scoped_padder>::format
          (r_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *tm_time,
          memory_buf_t *dest)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  byte bVar4;
  buffer<char> *buf;
  uint uVar5;
  ulong uVar6;
  char *begin;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  format_args args;
  format_args args_00;
  format_args args_01;
  scoped_padder p;
  uint local_58 [4];
  scoped_padder local_48;
  
  scoped_padder::scoped_padder(&local_48,0xb,&(this->super_flag_formatter).padinfo_,dest);
  uVar1 = tm_time->tm_hour;
  uVar5 = uVar1 - 0xc;
  if ((int)uVar1 < 0xd) {
    uVar5 = uVar1;
  }
  if (uVar5 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar6 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar5 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar6 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar5 + bVar4 * -10 | 0x30;
  }
  else {
    fmt.size_ = 5;
    fmt.data_ = "{:02}";
    args.field_1.values_ = (value<fmt::v11::context> *)local_58;
    args.desc_ = 1;
    local_58[0] = uVar5;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt,args,(locale_ref)0x0);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar6 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_min;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar6 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar6 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    fmt_00.size_ = 5;
    fmt_00.data_ = "{:02}";
    args_00.field_1.values_ = (value<fmt::v11::context> *)local_58;
    args_00.desc_ = 1;
    local_58[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_00,args_00,(locale_ref)0x0);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar6 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar3] = ':';
  uVar1 = tm_time->tm_sec;
  if (uVar1 < 100) {
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar6 = sVar3 + 1;
    }
    bVar4 = (byte)((uVar1 & 0xff) / 10);
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar3] = bVar4 | 0x30;
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
    if ((dest->super_buffer<char>).capacity_ < uVar6) {
      (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
      sVar3 = (dest->super_buffer<char>).size_;
      uVar6 = sVar3 + 1;
    }
    (dest->super_buffer<char>).size_ = uVar6;
    (dest->super_buffer<char>).ptr_[sVar3] = (char)uVar1 + bVar4 * -10 | 0x30;
  }
  else {
    fmt_01.size_ = 5;
    fmt_01.data_ = "{:02}";
    args_01.field_1.values_ = (value<fmt::v11::context> *)local_58;
    args_01.desc_ = 1;
    local_58[0] = uVar1;
    ::fmt::v11::detail::vformat_to(&dest->super_buffer<char>,fmt_01,args_01,(locale_ref)0x0);
  }
  sVar3 = (dest->super_buffer<char>).size_;
  uVar6 = sVar3 + 1;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (*(dest->super_buffer<char>).grow_)(&dest->super_buffer<char>,uVar6);
    sVar3 = (dest->super_buffer<char>).size_;
    uVar6 = sVar3 + 1;
  }
  (dest->super_buffer<char>).size_ = uVar6;
  (dest->super_buffer<char>).ptr_[sVar3] = ' ';
  begin = "AM";
  if (0xb < tm_time->tm_hour) {
    begin = "PM";
  }
  pcVar2 = "AM";
  if (0xb < tm_time->tm_hour) {
    pcVar2 = "PM";
  }
  ::fmt::v11::detail::buffer<char>::append<char>(&dest->super_buffer<char>,begin,pcVar2 + 2);
  scoped_padder::~scoped_padder(&local_48);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &tm_time, memory_buf_t &dest) override {
        const size_t field_size = 11;
        ScopedPadder p(field_size, padinfo_, dest);

        fmt_helper::pad2(to12h(tm_time), dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_min, dest);
        dest.push_back(':');
        fmt_helper::pad2(tm_time.tm_sec, dest);
        dest.push_back(' ');
        fmt_helper::append_string_view(ampm(tm_time), dest);
    }